

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RAM.c
# Opt level: O2

uint8_t read_RAM(uint16_t address)

{
  uint8_t uVar1;
  uint16_t uVar2;
  
  uVar2 = sanitize_RAM_address(address);
  if (uVar2 == 0x4016) {
    uVar1 = read_controller();
    return uVar1;
  }
  if (uVar2 != 0x2004) {
    if (uVar2 == 0x2007) {
      uVar1 = PPUDATA_VRAM_read();
      increment_ppu_address(RAM[0x2000]);
    }
    else {
      uVar1 = RAM[uVar2];
      if (uVar2 == 0x2002) {
        RAM[0x2002] = RAM[0x2002] & 0x7f;
        clear_write_toggle();
      }
    }
    return uVar1;
  }
  uVar1 = get_OAM_data();
  return uVar1;
}

Assistant:

uint8_t read_RAM(uint16_t address) {
    address = sanitize_RAM_address(address);
    uint8_t retval = RAM[address];

    if(address == PPUSTATUS_ADDRESS) {
        clear_vblank_bit();
        clear_write_toggle();
    }
    else if(address == PPUDATA_ADDRESS) {
        retval = PPUDATA_VRAM_read();
        increment_ppu_address(RAM[PPUCTRL_ADDRESS]);
    }
    else if(address == OAMDATA_ADDRESS)
        retval = get_OAM_data();
    else if(address == JOYPAD1_ADDRESS)
        retval = read_controller();

    return retval;
}